

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::RegisterStatsByIp(DnsStats *this,uint8_t *dest_addr,size_t dest_addr_length)

{
  StatsByIP *pSVar1;
  bool stored;
  StatsByIP x;
  
  StatsByIP::StatsByIP
            (&x,dest_addr,dest_addr_length,this->is_do_flag_set,this->is_using_edns,
             (bool)(this->is_qname_minimized ^ 1),this->is_recursive_query);
  pSVar1 = BinHash<StatsByIP>::Retrieve(&this->statsByIp,&x);
  x.response_seen = true;
  if (pSVar1 == (StatsByIP *)0x0) {
    if ((this->statsByIp).tableCount < this->max_stats_by_ip_count) {
      stored = false;
      BinHash<StatsByIP>::InsertOrAdd(&this->statsByIp,&x,true,&stored);
    }
  }
  else {
    (*pSVar1->_vptr_StatsByIP[3])(pSVar1,&x);
  }
  StatsByIP::~StatsByIP(&x);
  return;
}

Assistant:

void DnsStats::RegisterStatsByIp(uint8_t * dest_addr, size_t dest_addr_length)
{
    StatsByIP x(dest_addr, dest_addr_length, is_do_flag_set, is_using_edns,
        !is_qname_minimized, is_recursive_query);
    StatsByIP * y = statsByIp.Retrieve(&x);

    x.response_seen = true;

    if (y == NULL) {
        if (statsByIp.GetCount() < max_stats_by_ip_count) {
            bool stored = false;

            (void)statsByIp.InsertOrAdd(&x, true, &stored);
        }
    }
    else {
        y->Add(&x);
    }
}